

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimeglobpattern.cpp
# Opt level: O2

void __thiscall QMimeAllGlobPatterns::addGlob(QMimeAllGlobPatterns *this,QMimeGlobPattern *glob)

{
  bool bVar1;
  uint uVar2;
  qsizetype qVar3;
  QListSpecialMethods<QString> *this_00;
  QMimeGlobPatternList *this_01;
  long in_FS_OFFSET;
  QStringView mimeType;
  QStringView pattern;
  QArrayDataPointer<char16_t> local_60;
  QArrayDataPointer<char16_t> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = glob->m_weight;
  if (uVar2 == 0x32) {
    local_48.ptr = (glob->m_pattern).d.ptr;
    local_48.d = (Data *)(glob->m_pattern).d.size;
    qVar3 = QStringView::lastIndexOf((QStringView *)&local_48,(QChar)0x2a,CaseSensitive);
    if (qVar3 == 0) {
      qVar3 = QStringView::lastIndexOf((QStringView *)&local_48,(QChar)0x2e,CaseSensitive);
      if (qVar3 == 1) {
        bVar1 = QStringView::contains((QStringView *)&local_48,(QChar)0x3f,CaseSensitive);
        if (!bVar1) {
          bVar1 = QStringView::contains((QStringView *)&local_48,(QChar)0x5b,CaseSensitive);
          if ((!bVar1) && (glob->m_caseSensitivity != CaseSensitive)) {
            local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            local_48.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
            QString::mid((QString *)&local_60,&glob->m_pattern,2,-1);
            QString::toLower_helper((QString *)&local_48,(QString *)&local_60);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
            this_00 = (QListSpecialMethods<QString> *)
                      QHash<QString,_QList<QString>_>::operator[]
                                (&this->m_fastPatterns,(QString *)&local_48);
            bVar1 = QListSpecialMethods<QString>::contains(this_00,&glob->m_mimeType,CaseSensitive);
            if (!bVar1) {
              QList<QString>::emplaceBack<QString_const&>
                        ((QList<QString> *)this_00,&glob->m_mimeType);
            }
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
            goto LAB_00444f18;
          }
        }
      }
    }
    uVar2 = glob->m_weight;
  }
  if (uVar2 < 0x33) {
    this_01 = &this->m_lowWeightGlobs;
  }
  else {
    this_01 = &this->m_highWeightGlobs;
  }
  mimeType.m_data = (glob->m_mimeType).d.ptr;
  mimeType.m_size = (glob->m_mimeType).d.size;
  pattern.m_data = (glob->m_pattern).d.ptr;
  pattern.m_size = (glob->m_pattern).d.size;
  bVar1 = QMimeGlobPatternList::hasPattern(this_01,mimeType,pattern);
  if (!bVar1) {
    QList<QMimeGlobPattern>::emplaceBack<QMimeGlobPattern_const&>
              (&this_01->super_QList<QMimeGlobPattern>,glob);
  }
LAB_00444f18:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMimeAllGlobPatterns::addGlob(const QMimeGlobPattern &glob)
{
    const QString &pattern = glob.pattern();
    Q_ASSERT(!pattern.isEmpty());

    // Store each patterns into either m_fastPatternDict (*.txt, *.html etc. with default weight 50)
    // or for the rest, like core.*, *.tar.bz2, *~, into highWeightPatternOffset (>50)
    // or lowWeightPatternOffset (<=50)

    if (glob.weight() == 50 && isFastPattern(pattern) && !glob.isCaseSensitive()) {
        // The bulk of the patterns is *.foo with weight 50 --> those go into the fast patterns hash.
        const QString extension = pattern.mid(2).toLower();
        QStringList &patterns = m_fastPatterns[extension]; // find or create
        if (!patterns.contains(glob.mimeType()))
            patterns.append(glob.mimeType());
    } else {
        if (glob.weight() > 50) {
            if (!m_highWeightGlobs.hasPattern(glob.mimeType(), glob.pattern()))
                m_highWeightGlobs.append(glob);
        } else {
            if (!m_lowWeightGlobs.hasPattern(glob.mimeType(), glob.pattern()))
                m_lowWeightGlobs.append(glob);
        }
    }
}